

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_decompress4X1_usingDTable_internal_fast
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 HUF_DecompressFastLoopFn loopFn)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  uint uVar6;
  BYTE *pBVar7;
  long lVar8;
  bool bVar9;
  BIT_DStream_t local_108;
  size_t local_e0;
  ulong local_d8;
  BYTE *local_d0;
  HUF_DecompressFastArgs args;
  
  sVar2 = HUF_DecompressFastArgs_init(&args,dst,dstSize,cSrc,cSrcSize,DTable);
  if (sVar2 - 1 < 0xffffffffffffff88) {
    if (args.ip[0] < args.ilimit) {
      __assert_fail("args.ip[0] >= args.ilimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8f5f,
                    "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    pBVar7 = (BYTE *)((long)cSrc + 6);
    HUF_decompress4X1_usingDTable_internal_fast_c_loop(&args);
    if (args.ip[0] < pBVar7) {
      __assert_fail("args.ip[0] >= iend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8f65,
                    "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    if (args.ip[1] < pBVar7) {
      __assert_fail("args.ip[1] >= iend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8f66,
                    "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    if (args.ip[2] < pBVar7) {
      __assert_fail("args.ip[2] >= iend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8f67,
                    "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    if (args.ip[3] < pBVar7) {
      __assert_fail("args.ip[3] >= iend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8f68,
                    "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    local_d0 = (BYTE *)((long)dst + dstSize);
    if (local_d0 < args.op[3]) {
      __assert_fail("args.op[3] <= oend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8f69,
                    "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    local_d8 = dstSize + 3 >> 2;
    lVar8 = 0;
    sVar2 = 0xffffffffffffffec;
    local_e0 = dstSize;
    do {
      if (lVar8 == 4) {
        if (local_e0 != 0) {
          return local_e0;
        }
        __assert_fail("dstSize != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8f7e,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      uVar3 = (long)local_d0 - (long)dst;
      dst = (BYTE *)((long)dst + local_d8);
      if (uVar3 < local_d8) {
        dst = local_d0;
      }
      sVar4 = HUF_initRemainingDStream(&local_108,&args,(int)lVar8,(BYTE *)dst);
      if (0xffffffffffffff88 < sVar4) {
        return sVar4;
      }
      pBVar7 = args.op[lVar8];
      lVar5 = (long)dst - (long)pBVar7;
      if (lVar5 < 4) {
        if (local_108.bitsConsumed < 0x41) {
          if (local_108.ptr < local_108.limitPtr) {
            if (local_108.ptr == local_108.start) goto LAB_001dfc76;
            uVar6 = (int)local_108.ptr - (int)local_108.start;
            if (local_108.start <=
                (size_t *)((long)local_108.ptr - (ulong)(local_108.bitsConsumed >> 3))) {
              uVar6 = local_108.bitsConsumed >> 3;
            }
            local_108.bitsConsumed = local_108.bitsConsumed + uVar6 * -8;
          }
          else {
            uVar6 = local_108.bitsConsumed >> 3;
            local_108.bitsConsumed = local_108.bitsConsumed & 7;
          }
          local_108.ptr = (char *)((long)local_108.ptr - (ulong)uVar6);
          local_108.bitContainer = *(size_t *)local_108.ptr;
        }
      }
      else {
        for (; local_108.bitsConsumed < 0x41;
            local_108.bitsConsumed = bVar1 + local_108.bitsConsumed) {
          if (local_108.ptr < local_108.limitPtr) {
            if (local_108.ptr == local_108.start) break;
            bVar9 = local_108.start <=
                    (size_t *)((long)local_108.ptr - (ulong)(local_108.bitsConsumed >> 3));
            uVar3 = (ulong)(uint)((int)local_108.ptr - (int)local_108.start);
            if (bVar9) {
              uVar3 = (ulong)(local_108.bitsConsumed >> 3);
            }
            local_108.bitsConsumed = local_108.bitsConsumed + (int)uVar3 * -8;
          }
          else {
            uVar3 = (ulong)(local_108.bitsConsumed >> 3);
            local_108.bitsConsumed = local_108.bitsConsumed & 7;
            bVar9 = true;
          }
          local_108.ptr = (char *)((long)local_108.ptr - uVar3);
          local_108.bitContainer = *(size_t *)local_108.ptr;
          if (((BYTE *)((long)dst + -3) <= pBVar7) || (!bVar9)) break;
          uVar3 = (local_108.bitContainer << ((ulong)local_108.bitsConsumed & 0x3f)) >> 0x35;
          local_108.bitsConsumed = *(byte *)((long)DTable + uVar3 * 2 + 4) + local_108.bitsConsumed;
          *pBVar7 = *(BYTE *)((long)DTable + uVar3 * 2 + 5);
          uVar3 = (local_108.bitContainer << ((ulong)local_108.bitsConsumed & 0x3f)) >> 0x35;
          local_108.bitsConsumed = *(byte *)((long)DTable + uVar3 * 2 + 4) + local_108.bitsConsumed;
          pBVar7[1] = *(BYTE *)((long)DTable + uVar3 * 2 + 5);
          uVar3 = (local_108.bitContainer << ((ulong)local_108.bitsConsumed & 0x3f)) >> 0x35;
          local_108.bitsConsumed = *(byte *)((long)DTable + uVar3 * 2 + 4) + local_108.bitsConsumed;
          pBVar7[2] = *(BYTE *)((long)DTable + uVar3 * 2 + 5);
          uVar3 = (local_108.bitContainer << ((ulong)local_108.bitsConsumed & 0x3f)) >> 0x35;
          bVar1 = *(byte *)((long)DTable + uVar3 * 2 + 4);
          pBVar7[3] = *(BYTE *)((long)DTable + uVar3 * 2 + 5);
          pBVar7 = pBVar7 + 4;
        }
      }
LAB_001dfc76:
      for (; pBVar7 < dst; pBVar7 = pBVar7 + 1) {
        uVar3 = (local_108.bitContainer << ((ulong)local_108.bitsConsumed & 0x3f)) >> 0x35;
        local_108.bitsConsumed = *(byte *)((long)DTable + uVar3 * 2 + 4) + local_108.bitsConsumed;
        *pBVar7 = *(BYTE *)((long)DTable + uVar3 * 2 + 5);
      }
      pBVar7 = args.op[lVar8];
      args.op[lVar8] = pBVar7 + lVar5;
      lVar8 = lVar8 + 1;
    } while (pBVar7 + lVar5 == (BYTE *)dst);
  }
  return sVar2;
}

Assistant:

static HUF_FAST_BMI2_ATTRS
size_t
HUF_decompress4X1_usingDTable_internal_fast(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable,
    HUF_DecompressFastLoopFn loopFn)
{
    void const* dt = DTable + 1;
    const BYTE* const iend = (const BYTE*)cSrc + 6;
    BYTE* const oend = (BYTE*)dst + dstSize;
    HUF_DecompressFastArgs args;
    {   size_t const ret = HUF_DecompressFastArgs_init(&args, dst, dstSize, cSrc, cSrcSize, DTable);
        FORWARD_IF_ERROR(ret, "Failed to init fast loop args");
        if (ret == 0)
            return 0;
    }

    assert(args.ip[0] >= args.ilimit);
    loopFn(&args);

    /* Our loop guarantees that ip[] >= ilimit and that we haven't
    * overwritten any op[].
    */
    assert(args.ip[0] >= iend);
    assert(args.ip[1] >= iend);
    assert(args.ip[2] >= iend);
    assert(args.ip[3] >= iend);
    assert(args.op[3] <= oend);
    (void)iend;

    /* finish bit streams one by one. */
    {   size_t const segmentSize = (dstSize+3) / 4;
        BYTE* segmentEnd = (BYTE*)dst;
        int i;
        for (i = 0; i < 4; ++i) {
            BIT_DStream_t bit;
            if (segmentSize <= (size_t)(oend - segmentEnd))
                segmentEnd += segmentSize;
            else
                segmentEnd = oend;
            FORWARD_IF_ERROR(HUF_initRemainingDStream(&bit, &args, i, segmentEnd), "corruption");
            /* Decompress and validate that we've produced exactly the expected length. */
            args.op[i] += HUF_decodeStreamX1(args.op[i], &bit, segmentEnd, (HUF_DEltX1 const*)dt, HUF_DECODER_FAST_TABLELOG);
            if (args.op[i] != segmentEnd) return ERROR(corruption_detected);
        }
    }

    /* decoded size */
    assert(dstSize != 0);
    return dstSize;
}